

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture2DArray::generate
          (Texture2DArray *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  PtrData<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_> data;
  long lVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Texture2DArray *this_00;
  MovePtr<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_> *this_01;
  undefined4 uVar4;
  undefined1 in_stack_ffffffffffffff8c [12];
  UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_> local_68;
  long local_50;
  Vec4 local_48;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  local_50 = CONCAT44(extraout_var,iVar2);
  this_00 = (Texture2DArray *)operator_new(0x70);
  uVar4 = 2;
  glu::Texture2DArray::Texture2DArray(this_00,context,format,type,size->m_data[0],size->m_data[1],2)
  ;
  local_68.m_data.ptr = (Texture2DArray *)0x0;
  this_01 = &this->m_texture;
  data._4_12_ = in_stack_ffffffffffffff8c;
  data.ptr._0_4_ = uVar4;
  de::details::UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>::assignData
            (&this_01->
              super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>,data);
  de::details::UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>::
  ~UniqueBase(&local_68);
  tcu::Texture2DArray::allocLevel
            (&((this_01->
               super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).
               m_data.ptr)->m_refTexture,0);
  tcu::Texture2DArray::allocLevel
            (&((this_01->
               super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).
               m_data.ptr)->m_refTexture,1);
  lVar1 = local_50;
  dVar3 = (**(code **)(local_50 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x16f);
  local_68.m_data.ptr = (Texture2DArray *)0x3f8000003f800000;
  local_68.m_data._8_8_ = 0x3f8000003f800000;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::fillWithGrid((((this_01->
                      super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>
                      ).m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,4,(Vec4 *)&local_68,&local_48);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x173);
  local_68.m_data.ptr = (Texture2DArray *)0x3f80000000000000;
  local_68.m_data._8_8_ = 0x3f8000003f800000;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::fillWithGrid((PixelBufferAccess *)
                    ((long)(((this_01->
                             super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>
                             ).m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x28),4,(Vec4 *)&local_68,
                    &local_48);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x177);
  glu::Texture2DArray::upload
            ((this_01->
             super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).m_data
             .ptr);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x17a);
  (**(code **)(lVar1 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture2DArray::generate(const glu::RenderContext& context, tcu::IVec3 size,
														glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture2DArray>(new glu::Texture2DArray(context, format, type, size.x(), size.y(), 2));

	m_texture->getRefTexture().allocLevel(0);
	m_texture->getRefTexture().allocLevel(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(1), 4, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	gl.activeTexture(GL_TEXTURE0);
}